

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmLocalGenerator.cxx
# Opt level: O1

vector<BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
* __thiscall
cmLocalGenerator::GetTargetCompileFlags
          (vector<BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
           *__return_storage_ptr__,cmLocalGenerator *this,cmGeneratorTarget *target,string *config,
          string *lang,string *arch)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  cmMakefile *pcVar2;
  pointer pcVar3;
  bool bVar4;
  int iVar5;
  cmLocalGenerator *this_00;
  string compileFlags;
  string local_70;
  _Alloc_hider local_50;
  cmState *local_48;
  undefined1 local_40;
  undefined7 uStack_3f;
  
  (__return_storage_ptr__->
  super__Vector_base<BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  )._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (__return_storage_ptr__->
  super__Vector_base<BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  )._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (__return_storage_ptr__->
  super__Vector_base<BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  )._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_50._M_p = &stack0xffffffffffffffc0;
  local_48 = (cmState *)0x0;
  local_40 = '\0';
  pcVar2 = this->Makefile;
  AddLanguageFlags(this,(string *)&stack0xffffffffffffffb0,target,Compile,lang,config);
  bVar4 = cmGeneratorTarget::IsIPOEnabled(target,lang,config);
  if (bVar4) {
    AppendFeatureOptions(this,(string *)&stack0xffffffffffffffb0,lang,"IPO");
  }
  AddArchitectureFlags(this,(string *)&stack0xffffffffffffffb0,target,lang,config,arch);
  iVar5 = std::__cxx11::string::compare((char *)lang);
  if (iVar5 == 0) {
    (*this->_vptr_cmLocalGenerator[0xf])(&local_70,this,target,config);
    (*this->_vptr_cmLocalGenerator[6])(this,&stack0xffffffffffffffb0,&local_70);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_70._M_dataplus._M_p != &local_70.field_2) {
      operator_delete(local_70._M_dataplus._M_p,local_70.field_2._M_allocated_capacity + 1);
    }
  }
  AddCMP0018Flags(this,(string *)&stack0xffffffffffffffb0,target,lang,config);
  AddVisibilityPresetFlags(this,(string *)&stack0xffffffffffffffb0,target,lang);
  AddColorDiagnosticsFlags(this,(string *)&stack0xffffffffffffffb0,lang);
  paVar1 = &local_70.field_2;
  pcVar3 = (pcVar2->DefineFlags)._M_dataplus._M_p;
  local_70._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_70,pcVar3,pcVar3 + (pcVar2->DefineFlags)._M_string_length);
  this_00 = (cmLocalGenerator *)&stack0xffffffffffffffb0;
  (*this->_vptr_cmLocalGenerator[6])(this,this_00,&local_70);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_70._M_dataplus._M_p != paVar1) {
    this_00 = (cmLocalGenerator *)(local_70.field_2._M_allocated_capacity + 1);
    operator_delete(local_70._M_dataplus._M_p,(ulong)this_00);
  }
  GetFrameworkFlags(&local_70,this_00,lang,config,target);
  (*this->_vptr_cmLocalGenerator[6])(this,&stack0xffffffffffffffb0,&local_70);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_70._M_dataplus._M_p != paVar1) {
    operator_delete(local_70._M_dataplus._M_p,local_70.field_2._M_allocated_capacity + 1);
  }
  if (local_48 != (cmState *)0x0) {
    std::vector<BT<std::__cxx11::string>,std::allocator<BT<std::__cxx11::string>>>::
    emplace_back<std::__cxx11::string>
              ((vector<BT<std::__cxx11::string>,std::allocator<BT<std::__cxx11::string>>> *)
               __return_storage_ptr__,
               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               &stack0xffffffffffffffb0);
  }
  AddCompileOptions(this,__return_storage_ptr__,target,lang,config);
  if (local_50._M_p != &stack0xffffffffffffffc0) {
    operator_delete(local_50._M_p,CONCAT71(uStack_3f,local_40) + 1);
  }
  return __return_storage_ptr__;
}

Assistant:

std::vector<BT<std::string>> cmLocalGenerator::GetTargetCompileFlags(
  cmGeneratorTarget* target, std::string const& config,
  std::string const& lang, std::string const& arch)
{
  std::vector<BT<std::string>> flags;
  std::string compileFlags;

  cmMakefile* mf = this->GetMakefile();

  // Add language-specific flags.
  this->AddLanguageFlags(compileFlags, target, cmBuildStep::Compile, lang,
                         config);

  if (target->IsIPOEnabled(lang, config)) {
    this->AppendFeatureOptions(compileFlags, lang, "IPO");
  }

  this->AddArchitectureFlags(compileFlags, target, lang, config, arch);

  if (lang == "Fortran") {
    this->AppendFlags(compileFlags,
                      this->GetTargetFortranFlags(target, config));
  }

  this->AddCMP0018Flags(compileFlags, target, lang, config);
  this->AddVisibilityPresetFlags(compileFlags, target, lang);
  this->AddColorDiagnosticsFlags(compileFlags, lang);
  this->AppendFlags(compileFlags, mf->GetDefineFlags());
  this->AppendFlags(compileFlags,
                    this->GetFrameworkFlags(lang, config, target));

  if (!compileFlags.empty()) {
    flags.emplace_back(std::move(compileFlags));
  }
  this->AddCompileOptions(flags, target, lang, config);
  return flags;
}